

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffasfm(char *tform,int *dtcode,long *twidth,int *decimals,int *status)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  char local_108 [8];
  char message [81];
  char local_a8;
  char acStack_a7 [7];
  char temp [71];
  char *form;
  long lStack_50;
  float fwidth;
  long width;
  long longval;
  int datacode;
  int ii;
  int *status_local;
  int *decimals_local;
  long *twidth_local;
  int *dtcode_local;
  char *tform_local;
  
  if (*status < 1) {
    if (dtcode != (int *)0x0) {
      *dtcode = 0;
    }
    if (twidth != (long *)0x0) {
      *twidth = 0;
    }
    if (decimals != (int *)0x0) {
      *decimals = 0;
    }
    longval._4_4_ = 0;
    while( true ) {
      bVar3 = false;
      if (tform[longval._4_4_] != '\0') {
        bVar3 = tform[longval._4_4_] == ' ';
      }
      if (!bVar3) break;
      longval._4_4_ = longval._4_4_ + 1;
    }
    _datacode = status;
    status_local = decimals;
    decimals_local = (int *)twidth;
    twidth_local = (long *)dtcode;
    dtcode_local = (int *)tform;
    sVar2 = strlen(tform + longval._4_4_);
    if (sVar2 < 0x47) {
      strcpy(&local_a8,(char *)((long)dtcode_local + (long)longval._4_4_));
      ffupch(&local_a8);
      unique0x00004880 = &local_a8;
      if (local_a8 == '\0') {
        ffpmsg("Error: ASCII table TFORM code is blank");
        *_datacode = 0x105;
        tform_local._4_4_ = 0x105;
      }
      else {
        if (local_a8 == 'A') {
          longval._0_4_ = 0x10;
        }
        else if (local_a8 == 'I') {
          longval._0_4_ = 0x29;
        }
        else if (local_a8 == 'F') {
          longval._0_4_ = 0x2a;
        }
        else if (local_a8 == 'E') {
          longval._0_4_ = 0x2a;
        }
        else {
          if (local_a8 != 'D') {
            snprintf(local_108,0x51,"Illegal ASCII table TFORMn datatype: \'%s\'",dtcode_local);
            ffpmsg(local_108);
            *_datacode = 0x106;
            return 0x106;
          }
          longval._0_4_ = 0x52;
        }
        if (twidth_local != (long *)0x0) {
          *(int *)twidth_local = (int)longval;
        }
        register0x00000000 = acStack_a7;
        if (((int)longval == 0x10) || ((int)longval == 0x29)) {
          iVar1 = ffc2ii(register0x00000000,&stack0xffffffffffffffb0,_datacode);
          if (iVar1 < 1) {
            if (lStack_50 < 1) {
              lStack_50 = 0;
              *_datacode = 0x105;
            }
            else if ((lStack_50 < 5) && ((int)longval == 0x29)) {
              longval._0_4_ = 0x15;
            }
          }
        }
        else {
          iVar1 = ffc2rr(register0x00000000,(float *)((long)&form + 4),_datacode);
          if (iVar1 < 1) {
            if (0.0 < form._4_4_) {
              lStack_50 = (long)form._4_4_;
              if ((7 < lStack_50) && (local_a8 == 'F')) {
                longval._0_4_ = 0x52;
              }
              if (lStack_50 < 10) {
                register0x00000000 = stack0xffffffffffffffa0 + 1;
              }
              else {
                register0x00000000 = stack0xffffffffffffffa0 + 2;
              }
              if (*stack0xffffffffffffffa0 == '.') {
                register0x00000000 = stack0xffffffffffffffa0 + 1;
                iVar1 = ffc2ii(register0x00000000,&width,_datacode);
                if (iVar1 < 1) {
                  if (status_local != (int *)0x0) {
                    *status_local = (int)width;
                  }
                  if (lStack_50 <= width) {
                    *_datacode = 0x105;
                  }
                  if ((6 < width) && (local_a8 == 'E')) {
                    longval._0_4_ = 0x52;
                  }
                }
              }
            }
            else {
              *_datacode = 0x105;
            }
          }
        }
        if (0 < *_datacode) {
          *_datacode = 0x105;
          snprintf(local_108,0x51,"Illegal ASCII table TFORMn code: \'%s\'",dtcode_local);
          ffpmsg(local_108);
        }
        if (twidth_local != (long *)0x0) {
          *(int *)twidth_local = (int)longval;
        }
        if (decimals_local != (int *)0x0) {
          *(long *)decimals_local = lStack_50;
        }
        tform_local._4_4_ = *_datacode;
      }
    }
    else {
      ffpmsg("Error: ASCII table TFORM code is too long (ffasfm)");
      *_datacode = 0x105;
      tform_local._4_4_ = 0x105;
    }
  }
  else {
    tform_local._4_4_ = *status;
  }
  return tform_local._4_4_;
}

Assistant:

int ffasfm(char *tform,    /* I - format code from the TFORMn keyword */
           int *dtcode,    /* O - numerical datatype code */
           long *twidth,   /* O - width of the field, in chars */
           int *decimals,  /* O - number of decimal places (F, E, D format) */
           int *status)    /* IO - error status      */
{
/*
  parse the ASCII table TFORM column format to determine the data
  type, the field width, and number of decimal places (if relevant)
*/
    int ii, datacode;
    long longval, width;
    float fwidth;
    char *form, temp[FLEN_VALUE], message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    if (dtcode)
        *dtcode = 0;

    if (twidth)
        *twidth = 0;

    if (decimals)
        *decimals = 0;

    ii = 0;
    while (tform[ii] != 0 && tform[ii] == ' ') /* find first non-blank char */
         ii++;

    if (strlen(&tform[ii]) > FLEN_VALUE-1)
    {
       ffpmsg("Error: ASCII table TFORM code is too long (ffasfm)");
       return(*status = BAD_TFORM);
    }
    strcpy(temp, &tform[ii]); /* copy format string */
    ffupch(temp);     /* make sure it is in upper case */
    form = temp;      /* point to start of format string */


    if (form[0] == 0)
    {
        ffpmsg("Error: ASCII table TFORM code is blank");
        return(*status = BAD_TFORM);
    }

    /*-----------------------------------------------*/
    /*       determine default datatype code         */
    /*-----------------------------------------------*/
    if (form[0] == 'A')
        datacode = TSTRING;
    else if (form[0] == 'I')
        datacode = TLONG;
    else if (form[0] == 'F')
        datacode = TFLOAT;
    else if (form[0] == 'E')
        datacode = TFLOAT;
    else if (form[0] == 'D')
        datacode = TDOUBLE;
    else
    {
        snprintf(message, FLEN_ERRMSG,
                "Illegal ASCII table TFORMn datatype: \'%s\'", tform);
        ffpmsg(message);
        return(*status = BAD_TFORM_DTYPE);
    }

    if (dtcode)
       *dtcode = datacode;

    form++;  /* point to the start of field width */

    if (datacode == TSTRING || datacode == TLONG)
    { 
        /*-----------------------------------------------*/
        /*              A or I data formats:             */
        /*-----------------------------------------------*/

        if (ffc2ii(form, &width, status) <= 0)  /* read the width field */
        {
            if (width <= 0)
            {
                width = 0;
                *status = BAD_TFORM;
            }
            else
            {                
                /* set to shorter precision if I4 or less */
                if (width <= 4 && datacode == TLONG)
                    datacode = TSHORT;
            }
        }
    }
    else
    {  
        /*-----------------------------------------------*/
        /*              F, E or D data formats:          */
        /*-----------------------------------------------*/

        if (ffc2rr(form, &fwidth, status) <= 0) /* read ww.dd width field */
        {
           if (fwidth <= 0.)
            *status = BAD_TFORM;
          else
          {
            width = (long) fwidth;  /* convert from float to long */

            if (width > 7 && *temp == 'F')
                datacode = TDOUBLE;  /* type double if >7 digits */

            if (width < 10)
                form = form + 1; /* skip 1 digit  */
            else
                form = form + 2; /* skip 2 digits */

            if (form[0] == '.') /* should be a decimal point here */
            {
                form++;  /*  point to start of decimals field */

                if (ffc2ii(form, &longval, status) <= 0) /* read decimals */
                {
                    if (decimals)
                        *decimals = longval;  /* long to short convertion */

                    if (longval >= width)  /* width < no. of decimals */
                        *status = BAD_TFORM; 

                    if (longval > 6 && *temp == 'E')
                        datacode = TDOUBLE;  /* type double if >6 digits */
                }
            }

          }
        }
    }
    if (*status > 0)
    {
        *status = BAD_TFORM;
        snprintf(message,FLEN_ERRMSG,"Illegal ASCII table TFORMn code: \'%s\'", tform);
        ffpmsg(message);
    }

    if (dtcode)
       *dtcode = datacode;

    if (twidth)
       *twidth = width;

    return(*status);
}